

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRefining.cpp
# Opt level: O1

void __thiscall wasm::anon_unknown_173::TypeRefining::run(TypeRefining *this,Module *module)

{
  StructValuesMap<wasm::LUBFinder> *combinedInfos;
  __node_base_ptr *pp_Var1;
  pointer pLVar2;
  pointer puVar3;
  long lVar4;
  pointer pHVar5;
  uintptr_t uVar6;
  Module *pMVar7;
  Global *pGVar8;
  long lVar9;
  uintptr_t *puVar10;
  pointer puVar11;
  DataSegment *pDVar12;
  long lVar13;
  TypeRefining *pTVar14;
  bool bVar15;
  bool bVar16;
  HeapTypeKind HVar17;
  Struct *pSVar18;
  StructValues<wasm::LUBFinder> *pSVar19;
  iterator iVar20;
  Type TVar21;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar22;
  const_iterator cVar23;
  pointer pFVar24;
  pointer puVar25;
  undefined1 auVar26 [8];
  pointer pHVar27;
  ulong uVar28;
  uint uVar29;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_4;
  ulong uVar30;
  pointer *ppFVar31;
  bool bVar32;
  uintptr_t *puVar33;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  long *plVar34;
  Module *pMVar35;
  pointer puVar36;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_1;
  optional<wasm::HeapType> oVar37;
  undefined1 local_388 [8];
  Propagator propagator;
  ContentOracle oracle;
  Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  local_2e0;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_208;
  undefined1 local_1b0 [8];
  FunctionStructValuesMap<wasm::LUBFinder> functionSetGetInfos;
  undefined1 local_160 [8];
  HeapType type;
  __node_base local_150;
  Type TStack_130;
  undefined1 auStack_128 [8];
  FunctionStructValuesMap<wasm::LUBFinder> functionNewInfos;
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_d8;
  Type local_a0;
  Type gufaType;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> allTypes;
  __node_base_ptr ap_Stack_68 [2];
  StructValuesMap<wasm::LUBFinder> *local_58;
  pointer local_50;
  TypeRefining *local_48;
  Module *local_40;
  pointer *local_38;
  
  if (((module->features).features & 0x400) != 0) {
    if ((((this->super_Pass).runner)->options).closedWorld == false) {
      pp_Var1 = &propagator.subTypes.typeSubTypes._M_h._M_single_bucket;
      Fatal::Fatal((Fatal *)pp_Var1);
      Fatal::operator<<((Fatal *)pp_Var1,(char (*) [37])0xde0c98);
      Fatal::~Fatal((Fatal *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
    }
    SubTypes::SubTypes((SubTypes *)local_388,module);
    local_48 = this;
    local_40 = module;
    if (this->gufa == false) {
      StructUtils::FunctionStructValuesMap<wasm::LUBFinder>::FunctionStructValuesMap
                ((FunctionStructValuesMap<wasm::LUBFinder> *)auStack_128,module);
      StructUtils::FunctionStructValuesMap<wasm::LUBFinder>::FunctionStructValuesMap
                ((FunctionStructValuesMap<wasm::LUBFinder> *)local_1b0,module);
      pTVar14 = local_48;
      oracle.options = (PassOptions *)&oracle.locationContents._M_h._M_bucket_count;
      oracle.locationContents._M_h._M_buckets = (__buckets_ptr)0x0;
      oracle.locationContents._M_h._M_bucket_count._0_1_ = 0;
      local_2e0.replacep = (Expression **)0x0;
      local_2e0.stack.usedFixed = 0;
      local_2e0.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2e0.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2e0.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2e0.currFunction = (Function *)0x0;
      local_2e0.currModule = (Module *)0x0;
      propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
           (__node_base_ptr)&PTR__WalkerPass_01095990;
      oracle.wasm = (Module *)(local_48->super_Pass).runner;
      local_208._M_buckets = (__buckets_ptr)auStack_128;
      local_208._M_bucket_count = (size_type)local_1b0;
      WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
      ::run((WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
             *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,module);
      pMVar35 = (Module *)(pTVar14->super_Pass).runner;
      if (oracle.wasm != pMVar35 && oracle.wasm != (Module *)0x0) goto LAB_00ad649b;
      puVar3 = (module->globals).
               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      oracle.wasm = pMVar35;
      local_2e0.currModule = module;
      for (puVar25 = (module->globals).
                     super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar25 != puVar3;
          puVar25 = puVar25 + 1) {
        pGVar8 = (puVar25->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if (*(char **)((long)&(pGVar8->super_Importable).module + 8) == (char *)0x0) {
          Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
          ::walk(&local_2e0,&pGVar8->init);
        }
      }
      ppFVar31 = (pointer *)
                 (local_40->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_38 = (pointer *)
                 (local_40->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (ppFVar31 != local_38) {
        do {
          pFVar24 = *ppFVar31;
          lVar4._0_4_ = pFVar24[2].packedType;
          lVar4._4_4_ = pFVar24[2].mutable_;
          if (lVar4 != 0) {
            Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
            ::walk(&local_2e0,(Expression **)&pFVar24[2].packedType);
          }
          puVar10 = (uintptr_t *)(*ppFVar31)[4].type.id;
          for (puVar33 = *(uintptr_t **)&(*ppFVar31)[3].packedType; puVar33 != puVar10;
              puVar33 = puVar33 + 1) {
            gufaType.id = *puVar33;
            Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
            ::walk(&local_2e0,(Expression **)&gufaType);
          }
          ppFVar31 = ppFVar31 + 1;
        } while (ppFVar31 != local_38);
      }
      puVar11 = (local_40->dataSegments).
                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar36 = (local_40->dataSegments).
                     super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar36 != puVar11;
          puVar36 = puVar36 + 1) {
        pDVar12 = (puVar36->_M_t).
                  super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                  .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar12->offset != (Expression *)0x0) {
          Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
          ::walk(&local_2e0,&pDVar12->offset);
        }
      }
      local_2e0.currModule = (Module *)0x0;
      gufaType.id = (uintptr_t)ap_Stack_68;
      ap_Stack_68[0] = (__node_base_ptr)0x0;
      local_160 = (undefined1  [8])&stack0xfffffffffffffed0;
      type.id = 1;
      local_150._M_nxt = (_Hash_node_base *)0x0;
      TStack_130.id = 0;
      if (functionNewInfos.
          super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
          ._M_h._M_bucket_count != 0) {
        plVar34 = (long *)functionNewInfos.
                          super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                          ._M_h._M_bucket_count;
        do {
          StructUtils::StructValuesMap<wasm::LUBFinder>::combineInto
                    ((StructValuesMap<wasm::LUBFinder> *)(plVar34 + 2),
                     (StructValuesMap<wasm::LUBFinder> *)&gufaType);
          plVar34 = (long *)*plVar34;
        } while (plVar34 != (long *)0x0);
      }
      if (functionSetGetInfos.
          super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
          ._M_h._M_bucket_count != 0) {
        plVar34 = (long *)functionSetGetInfos.
                          super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                          ._M_h._M_bucket_count;
        do {
          StructUtils::StructValuesMap<wasm::LUBFinder>::combineInto
                    ((StructValuesMap<wasm::LUBFinder> *)(plVar34 + 2),
                     (StructValuesMap<wasm::LUBFinder> *)local_160);
          plVar34 = (long *)*plVar34;
        } while (plVar34 != (long *)0x0);
      }
      StructUtils::TypeHierarchyPropagator<wasm::LUBFinder>::propagate
                ((TypeHierarchyPropagator<wasm::LUBFinder> *)local_388,
                 (StructValuesMap<wasm::LUBFinder> *)&gufaType,false,true);
      StructUtils::TypeHierarchyPropagator<wasm::LUBFinder>::propagate
                ((TypeHierarchyPropagator<wasm::LUBFinder> *)local_388,
                 (StructValuesMap<wasm::LUBFinder> *)local_160,true,true);
      combinedInfos = &local_48->finalInfos;
      StructUtils::StructValuesMap<wasm::LUBFinder>::combineInto
                ((StructValuesMap<wasm::LUBFinder> *)&gufaType,combinedInfos);
      StructUtils::StructValuesMap<wasm::LUBFinder>::combineInto
                ((StructValuesMap<wasm::LUBFinder> *)local_160,combinedInfos);
      std::
      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_160);
      std::
      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&gufaType);
      pMVar35 = local_40;
      if (local_2e0.stack.flexible.
          super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2e0.stack.flexible.
                        super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2e0.stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2e0.stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      Pass::~Pass((Pass *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
      std::
      _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_1b0);
      std::
      _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)auStack_128);
    }
    else {
      ContentOracle::ContentOracle
                ((ContentOracle *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,module,
                 &((this->super_Pass).runner)->options);
      wasm::ModuleUtils::collectHeapTypes
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gufaType,module);
      local_50 = (pointer)allTypes.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_start;
      if ((pointer)gufaType.id !=
          allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_58 = &local_48->finalInfos;
        TVar21 = gufaType;
        do {
          local_160 = *(undefined1 (*) [8])TVar21.id;
          local_38 = (pointer *)TVar21.id;
          HVar17 = HeapType::getKind((HeapType *)local_160);
          if (HVar17 == Struct) {
            pSVar18 = HeapType::getStruct((HeapType *)local_160);
            pSVar19 = StructUtils::StructValuesMap<wasm::LUBFinder>::operator[]
                                (local_58,(HeapType)local_160);
            if ((pSVar18->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                (pSVar18->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              uVar29 = 1;
              uVar28 = 0;
              do {
                auStack_128 = local_160;
                functionNewInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                ._M_h._M_buckets =
                     (__buckets_ptr)
                     CONCAT44(functionNewInfos.
                              super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                              ._M_h._M_buckets._4_4_,uVar29 - 1);
                functionNewInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                ._M_h._M_before_begin._M_nxt._0_1_ = 7;
                iVar20 = std::
                         _Hashtable<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>,_std::allocator<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::hash<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find((_Hashtable<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>,_std::allocator<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::hash<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)&oracle.options,(key_type *)auStack_128);
                if (iVar20.
                    super__Node_iterator_base<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>,_true>
                    ._M_cur == (__node_type *)0x0) {
                  functionSetGetInfos.
                  super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                  ._M_h._M_before_begin._M_nxt._0_1_ = 0;
                }
                else {
                  std::__detail::__variant::
                  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                                     *)local_1b0,
                                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                                     *)((long)iVar20.
                                              super__Node_iterator_base<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>,_true>
                                              ._M_cur + 0x28));
                }
                local_a0 = PossibleContents::getType((PossibleContents *)local_1b0);
                std::__detail::__variant::
                _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                ::~_Variant_storage((_Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                                     *)local_1b0);
                bVar15 = wasm::Type::isExact(&(pSVar18->fields).
                                              super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar28].type
                                            );
                if (!bVar15) {
                  local_a0 = wasm::Type::withInexactIfNoCustomDescs
                                       (&local_a0,(FeatureSet)(local_40->features).features);
                }
                TVar21 = wasm::Type::getLeastUpperBound((Type)0x1,local_a0);
                pLVar2 = (pSVar19->super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                         super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                if ((ulong)((long)(pSVar19->
                                  super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                                  super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar2 >> 3) <=
                    uVar28) goto LAB_00ad645d;
                pLVar2[uVar28].lub.id = TVar21.id;
                uVar28 = (ulong)uVar29;
                uVar29 = uVar29 + 1;
              } while (uVar28 < (ulong)((long)(pSVar18->fields).
                                              super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pSVar18->fields).
                                              super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 4));
            }
          }
          TVar21.id = (uintptr_t)(local_38 + 1);
        } while ((pointer)TVar21.id != local_50);
      }
      puVar25 = (local_40->globals).
                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (local_40->globals).
               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pMVar35 = local_40;
      if (puVar25 != puVar3) {
        functionSetGetInfos.
        super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
        ._M_h._M_single_bucket = (__node_base_ptr)&local_48->finalInfos;
        do {
          if (*(char **)((long)&(((puVar25->_M_t).
                                  super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                  .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->
                                super_Importable).module + 8) == (char *)0x0) {
            FindAll<wasm::StructNew>::FindAll
                      ((FindAll<wasm::StructNew> *)auStack_128,
                       ((puVar25->_M_t).
                        super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                        super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->init);
            local_58 = (StructValuesMap<wasm::LUBFinder> *)
                       functionNewInfos.
                       super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                       ._M_h._M_buckets;
            auVar26 = auStack_128;
            if (auStack_128 !=
                (undefined1  [8])
                functionNewInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                ._M_h._M_buckets) {
              do {
                ppFVar31 = (pointer *)(((pointer)auVar26)->type).id;
                if ((((Struct *)(ppFVar31 + 3))->fields).
                    super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  local_38 = ppFVar31;
                  local_1b0 = (undefined1  [8])wasm::Type::getHeapType((Type *)(ppFVar31 + 1));
                  pSVar19 = StructUtils::StructValuesMap<wasm::LUBFinder>::operator[]
                                      ((StructValuesMap<wasm::LUBFinder> *)
                                       functionSetGetInfos.
                                       super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                                       ._M_h._M_single_bucket,(HeapType)local_1b0);
                  local_50 = (pointer)auVar26;
                  pSVar18 = HeapType::getStruct((HeapType *)local_1b0);
                  auVar26 = (undefined1  [8])local_50;
                  if ((pSVar18->fields).
                      super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                      super__Vector_impl_data._M_finish !=
                      (pSVar18->fields).
                      super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                      super__Vector_impl_data._M_start) {
                    uVar29 = 1;
                    uVar28 = 0;
                    do {
                      if ((((Struct *)(local_38 + 3))->fields).
                          super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                          super__Vector_impl_data._M_start <= uVar28) {
                        __assert_fail("index < usedElements",
                                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                                      ,0xbc,
                                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                                     );
                      }
                      pLVar2 = (pSVar19->
                               super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                               super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      if ((ulong)((long)(pSVar19->
                                        super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>
                                        ).
                                        super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar2 >>
                                 3) <= uVar28) goto LAB_00ad645d;
                      TVar21 = wasm::Type::getLeastUpperBound
                                         (pLVar2[uVar28].lub.id,
                                          *(uintptr_t *)((&local_38[2]->type)[uVar28].id + 8));
                      pLVar2[uVar28].lub.id = TVar21.id;
                      uVar28 = (ulong)uVar29;
                      uVar29 = uVar29 + 1;
                      auVar26 = (undefined1  [8])local_50;
                      pMVar35 = local_40;
                    } while (uVar28 < (ulong)((long)(pSVar18->fields).
                                                                                                        
                                                  super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(pSVar18->fields).
                                                                                                        
                                                  super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 4));
                  }
                }
                auVar26 = (undefined1  [8])&((pointer)auVar26)->packedType;
              } while (auVar26 != (undefined1  [8])local_58);
            }
            if (auStack_128 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_128,
                              functionNewInfos.
                              super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                              ._M_h._M_bucket_count - (long)auStack_128);
            }
          }
          puVar25 = puVar25 + 1;
        } while (puVar25 != puVar3);
      }
      StructUtils::TypeHierarchyPropagator<wasm::LUBFinder>::propagate
                ((TypeHierarchyPropagator<wasm::LUBFinder> *)local_388,&local_48->finalInfos,false,
                 true);
      if (gufaType.id != 0) {
        operator_delete((void *)gufaType.id,
                        (long)allTypes.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_finish - gufaType.id);
      }
      std::
      _Hashtable<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>,_std::allocator<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::hash<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>,_std::allocator<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::hash<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&oracle.options);
    }
    wasm::ModuleUtils::getPublicHeapTypes
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_160,pMVar35);
    std::
    _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _Hashtable<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
              ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_1b0,local_160,type.id,0,
               &propagator.subTypes.typeSubTypes._M_h._M_single_bucket,auStack_128,&gufaType);
    functionNewInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
    ._M_h._M_rehash_policy._M_next_resize = 0;
    functionNewInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
    ._M_h._M_single_bucket = (__node_base_ptr)0x0;
    functionNewInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
    ._M_h._M_element_count = 0;
    functionNewInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
    ._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    functionNewInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
    ._M_h._M_rehash_policy._4_4_ = 0;
    functionNewInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
    ._M_h._M_bucket_count = 0;
    functionNewInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
    ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    auStack_128 = (undefined1  [8])0x0;
    functionNewInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
    ._M_h._M_buckets = (__buckets_ptr)0x0;
    std::_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::_M_initialize_map
              ((_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_128,0);
    local_d8._M_buckets = &local_d8._M_single_bucket;
    local_d8._M_bucket_count = 1;
    local_d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_d8._M_element_count = 0;
    local_d8._M_rehash_policy._M_max_load_factor = 1.0;
    local_d8._M_rehash_policy._M_next_resize = 0;
    local_d8._M_single_bucket = (__node_base_ptr)0x0;
    if (local_388 !=
        (undefined1  [8])
        propagator.subTypes.types.
        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pp_Var1 = &propagator.subTypes.typeSubTypes._M_h._M_single_bucket;
      auVar26 = local_388;
      do {
        propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
             (__node_base_ptr)((pointer)auVar26)->id;
        HVar17 = HeapType::getKind((HeapType *)pp_Var1);
        if ((HVar17 == Struct) &&
           (oVar37 = HeapType::getDeclaredSuperType((HeapType *)pp_Var1),
           ((undefined1  [16])
            oVar37.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
           (undefined1  [16])0x0)) {
          UniqueDeferredQueue<wasm::HeapType>::push
                    ((UniqueDeferredQueue<wasm::HeapType> *)auStack_128,
                     (HeapType)propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
        }
        auVar26 = (undefined1  [8])((long)auVar26 + 8);
      } while (auVar26 !=
               (undefined1  [8])
               propagator.subTypes.types.
               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_start);
    }
    local_50 = (pointer)&local_48->finalInfos;
    bVar32 = false;
    bVar15 = false;
    while (pMVar35 = local_40, pTVar14 = local_48,
          ((long)(functionNewInfos.
                  super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                  ._M_h._M_element_count -
                 functionNewInfos.
                 super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                 ._M_h._M_bucket_count) >> 3) +
          ((long)(functionNewInfos.
                  super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                  ._M_h._M_rehash_policy._M_next_resize -
                 (long)functionNewInfos.
                       super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                       ._M_h._M_single_bucket) >> 3) +
          ((ulong)-functionNewInfos.
                   super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                   ._M_h._M_rehash_policy._0_8_ >> 3) * 0x40 != 0) {
      gufaType.id = (uintptr_t)
                    UniqueDeferredQueue<wasm::HeapType>::pop
                              ((UniqueDeferredQueue<wasm::HeapType> *)auStack_128);
      pvVar22 = SubTypes::getImmediateSubTypes((SubTypes *)local_388,(HeapType)gufaType.id);
      pHVar5 = (pvVar22->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      for (pHVar27 = (pvVar22->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                     _M_impl.super__Vector_impl_data._M_start; pHVar27 != pHVar5;
          pHVar27 = pHVar27 + 1) {
        UniqueDeferredQueue<wasm::HeapType>::push
                  ((UniqueDeferredQueue<wasm::HeapType> *)auStack_128,(HeapType)pHVar27->id);
      }
      cVar23 = std::
               _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)local_1b0,(key_type *)&gufaType);
      if (cVar23.super__Node_iterator_base<wasm::HeapType,_true>._M_cur == (__node_type *)0x0) {
        local_38 = (pointer *)HeapType::getStruct((HeapType *)&gufaType);
        pFVar24 = *local_38;
        if (local_38[1] != pFVar24) {
          uVar28 = 0;
          uVar30 = 1;
          do {
            TVar21.id = pFVar24[uVar28].type.id;
            pSVar19 = StructUtils::StructValuesMap<wasm::LUBFinder>::operator[]
                                ((StructValuesMap<wasm::LUBFinder> *)local_50,(HeapType)gufaType.id)
            ;
            pLVar2 = (pSVar19->super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                     super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(pSVar19->
                              super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                              super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pLVar2 >> 3) <=
                uVar28) goto LAB_00ad645d;
            if (pLVar2[uVar28].lub.id == 1) {
              TVar21 = wasm::Type::getLeastUpperBound((Type)0x1,TVar21);
              pLVar2[uVar28].lub.id = TVar21.id;
            }
            pFVar24 = *local_38;
            bVar16 = uVar30 < (ulong)((long)local_38[1] - (long)pFVar24 >> 4);
            uVar28 = uVar30;
            uVar30 = (ulong)((int)uVar30 + 1);
          } while (bVar16);
        }
        oVar37 = HeapType::getDeclaredSuperType((HeapType *)&gufaType);
        ppFVar31 = local_38;
        propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
             oVar37.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
        oracle.wasm = (Module *)
                      CONCAT71(oracle.wasm._1_7_,
                               oVar37.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::HeapType>._M_engaged);
        if ((((undefined1  [16])
              oVar37.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
             (undefined1  [16])0x0) &&
           (local_58 = (StructValuesMap<wasm::LUBFinder> *)
                       HeapType::getStruct((HeapType *)
                                           &propagator.subTypes.typeSubTypes._M_h._M_single_bucket),
           (pointer)(local_58->
                    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>_>
                    )._M_h._M_bucket_count !=
           (((_Vector_impl *)
            &(local_58->
             super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>_>
             )._M_h._M_buckets)->super__Vector_impl_data)._M_start)) {
          uVar28 = 0;
          uVar30 = 1;
          do {
            cVar23 = std::
                     _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)local_1b0,
                            (key_type *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
            if (cVar23.super__Node_iterator_base<wasm::HeapType,_true>._M_cur == (__node_type *)0x0)
            {
              pSVar19 = StructUtils::StructValuesMap<wasm::LUBFinder>::operator[]
                                  ((StructValuesMap<wasm::LUBFinder> *)local_50,
                                   (HeapType)propagator.subTypes.typeSubTypes._M_h._M_single_bucket)
              ;
              pLVar2 = (pSVar19->super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                       super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>._M_impl
                       .super__Vector_impl_data._M_start;
              if ((ulong)((long)(pSVar19->
                                super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                                super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar2 >> 3) <=
                  uVar28) goto LAB_00ad645d;
              pFVar24 = (pointer)(pLVar2 + uVar28);
            }
            else {
              pFVar24 = (((_Vector_impl *)
                         &(local_58->
                          super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>_>
                          )._M_h._M_buckets)->super__Vector_impl_data)._M_start + uVar28;
            }
            TVar21.id = (pFVar24->type).id;
            pSVar19 = StructUtils::StructValuesMap<wasm::LUBFinder>::operator[]
                                ((StructValuesMap<wasm::LUBFinder> *)local_50,(HeapType)gufaType.id)
            ;
            pLVar2 = (pSVar19->super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                     super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(pSVar19->
                              super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                              super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pLVar2 >> 3) <=
                uVar28) goto LAB_00ad645d;
            bVar16 = wasm::Type::isSubType((Type)pLVar2[uVar28].lub.id,TVar21);
            if (bVar16) {
              if ((*local_38)[uVar28].mutable_ == Mutable) {
                TVar21 = wasm::Type::getLeastUpperBound((Type)0x1,TVar21);
                goto LAB_00ad5f53;
              }
            }
            else {
              TVar21 = wasm::Type::getLeastUpperBound((Type)0x1,TVar21);
LAB_00ad5f53:
              pLVar2[uVar28].lub.id = TVar21.id;
            }
            bVar16 = uVar30 < (ulong)((long)(local_58->
                                            super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>_>
                                            )._M_h._M_bucket_count -
                                      (long)(((_Vector_impl *)
                                             &(local_58->
                                              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>_>
                                              )._M_h._M_buckets)->super__Vector_impl_data)._M_start
                                     >> 4);
            uVar28 = uVar30;
            uVar30 = (ulong)((int)uVar30 + 1);
            ppFVar31 = local_38;
          } while (bVar16);
        }
        pFVar24 = *ppFVar31;
        if (ppFVar31[1] != pFVar24) {
          uVar29 = 1;
          uVar28 = 0;
          bVar32 = bVar15;
          do {
            uVar6 = pFVar24[uVar28].type.id;
            pSVar19 = StructUtils::StructValuesMap<wasm::LUBFinder>::operator[]
                                ((StructValuesMap<wasm::LUBFinder> *)local_50,(HeapType)gufaType.id)
            ;
            pLVar2 = (pSVar19->super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                     super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(pSVar19->
                              super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                              super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pLVar2 >> 3) <=
                uVar28) {
LAB_00ad645d:
              __assert_fail("index < this->size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/struct-utils.h"
                            ,0x27,
                            "T &wasm::StructUtils::StructValues<wasm::LUBFinder>::operator[](size_t) [T = wasm::LUBFinder]"
                           );
            }
            if (pLVar2[uVar28].lub.id != uVar6) {
              bVar32 = true;
            }
            uVar28 = (ulong)uVar29;
            pFVar24 = *local_38;
            uVar29 = uVar29 + 1;
            bVar15 = bVar32;
          } while (uVar28 < (ulong)((long)local_38[1] - (long)pFVar24 >> 4));
        }
      }
    }
    if (bVar32) {
      oracle.options = (PassOptions *)&oracle.locationContents._M_h._M_bucket_count;
      oracle.locationContents._M_h._M_buckets = (__buckets_ptr)0x0;
      oracle.locationContents._M_h._M_bucket_count._0_1_ = 0;
      local_2e0.replacep = (Expression **)0x0;
      local_2e0.stack.usedFixed = 0;
      local_2e0.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2e0.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2e0.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2e0.currFunction = (Function *)0x0;
      local_2e0.currModule = (Module *)0x0;
      propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
           (__node_base_ptr)&PTR__WalkerPass_01095a50;
      local_208._M_buckets = (__buckets_ptr)local_48;
      oracle.wasm = (Module *)(local_48->super_Pass).runner;
      WalkerPass<wasm::PostWalker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_>_>::run
                ((WalkerPass<wasm::PostWalker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_>_> *)
                 &propagator.subTypes.typeSubTypes._M_h._M_single_bucket,local_40);
      pMVar7 = (Module *)(pTVar14->super_Pass).runner;
      if (oracle.wasm != pMVar7 && oracle.wasm != (Module *)0x0) {
LAB_00ad649b:
        __assert_fail("(!runner || runner == runner_) && \"Pass already had a runner\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                      ,0x1dd,"void wasm::Pass::setPassRunner(PassRunner *)");
      }
      local_2e0.currModule = pMVar35;
      puVar3 = (pMVar35->globals).
               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      oracle.wasm = pMVar7;
      for (puVar25 = (pMVar35->globals).
                     super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar25 != puVar3;
          puVar25 = puVar25 + 1) {
        pGVar8 = (puVar25->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if (*(char **)((long)&(pGVar8->super_Importable).module + 8) == (char *)0x0) {
          Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_>::walk
                    ((Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_> *)&local_2e0,
                     &pGVar8->init);
        }
      }
      ppFVar31 = (pointer *)
                 (local_40->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_38 = (pointer *)
                 (local_40->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (ppFVar31 != local_38) {
        do {
          pFVar24 = *ppFVar31;
          lVar9._0_4_ = pFVar24[2].packedType;
          lVar9._4_4_ = pFVar24[2].mutable_;
          if (lVar9 != 0) {
            Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_>::walk
                      ((Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_> *)&local_2e0,
                       (Expression **)&pFVar24[2].packedType);
          }
          puVar10 = (uintptr_t *)(*ppFVar31)[4].type.id;
          for (puVar33 = *(uintptr_t **)&(*ppFVar31)[3].packedType; puVar33 != puVar10;
              puVar33 = puVar33 + 1) {
            gufaType.id = *puVar33;
            Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_>::walk
                      ((Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_> *)&local_2e0,
                       (Expression **)&gufaType);
          }
          ppFVar31 = ppFVar31 + 1;
        } while (ppFVar31 != local_38);
      }
      puVar11 = (local_40->dataSegments).
                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar36 = (local_40->dataSegments).
                     super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar36 != puVar11;
          puVar36 = puVar36 + 1) {
        pDVar12 = (puVar36->_M_t).
                  super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                  .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar12->offset != (Expression *)0x0) {
          Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_>::walk
                    ((Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_> *)&local_2e0,
                     &pDVar12->offset);
        }
      }
      local_2e0.currModule = (Module *)0x0;
      if (local_2e0.stack.flexible.
          super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2e0.stack.flexible.
                        super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2e0.stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2e0.stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      Pass::~Pass((Pass *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
      pMVar35 = local_40;
      GlobalTypeRewriter::GlobalTypeRewriter
                ((GlobalTypeRewriter *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,
                 local_40);
      propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
           (__node_base_ptr)&PTR__GlobalTypeRewriter_01095ab0;
      local_2e0.stack.fixed._M_elems[0].func = (TaskFunc)local_48;
      gufaType.id = 0;
      GlobalTypeRewriter::update
                ((GlobalTypeRewriter *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,
                 (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gufaType);
      if (gufaType.id != 0) {
        operator_delete((void *)gufaType.id,-gufaType.id);
      }
      GlobalTypeRewriter::~GlobalTypeRewriter
                ((GlobalTypeRewriter *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
      ReFinalize::ReFinalize((ReFinalize *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
      WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
      ::run((WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
             *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,(local_48->super_Pass).runner
            ,pMVar35);
      propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
           (__node_base_ptr)&PTR__ReFinalize_01090960;
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_208);
      if (local_2e0.stack.flexible.
          super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2e0.stack.flexible.
                        super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2e0.stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2e0.stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      Pass::~Pass((Pass *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
      pTVar14 = local_48;
      oracle.options = (PassOptions *)&oracle.locationContents._M_h._M_bucket_count;
      oracle.locationContents._M_h._M_buckets = (__buckets_ptr)0x0;
      oracle.locationContents._M_h._M_bucket_count._0_1_ = 0;
      local_2e0.replacep = (Expression **)0x0;
      local_2e0.stack.usedFixed = 0;
      local_2e0.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2e0.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2e0.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2e0.currFunction = (Function *)0x0;
      local_2e0.currModule = (Module *)0x0;
      propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
           (__node_base_ptr)&PTR__WalkerPass_01095b00;
      oracle.wasm = (Module *)(local_48->super_Pass).runner;
      WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>::run
                ((WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_> *)
                 &propagator.subTypes.typeSubTypes._M_h._M_single_bucket,pMVar35);
      pMVar7 = (Module *)(pTVar14->super_Pass).runner;
      if (oracle.wasm != pMVar7 && oracle.wasm != (Module *)0x0) goto LAB_00ad649b;
      local_2e0.currModule = pMVar35;
      puVar3 = (pMVar35->globals).
               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      oracle.wasm = pMVar7;
      for (puVar25 = (pMVar35->globals).
                     super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar25 != puVar3;
          puVar25 = puVar25 + 1) {
        pGVar8 = (puVar25->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if (*(char **)((long)&(pGVar8->super_Importable).module + 8) == (char *)0x0) {
          Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::walk
                    ((Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_> *)&local_2e0,
                     &pGVar8->init);
        }
      }
      ppFVar31 = (pointer *)
                 (local_40->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_38 = (pointer *)
                 (local_40->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (ppFVar31 != local_38) {
        do {
          pFVar24 = *ppFVar31;
          lVar13._0_4_ = pFVar24[2].packedType;
          lVar13._4_4_ = pFVar24[2].mutable_;
          if (lVar13 != 0) {
            Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::walk
                      ((Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_> *)&local_2e0,
                       (Expression **)&pFVar24[2].packedType);
          }
          puVar10 = (uintptr_t *)(*ppFVar31)[4].type.id;
          for (puVar33 = *(uintptr_t **)&(*ppFVar31)[3].packedType; puVar33 != puVar10;
              puVar33 = puVar33 + 1) {
            gufaType.id = *puVar33;
            Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::walk
                      ((Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_> *)&local_2e0,
                       (Expression **)&gufaType);
          }
          ppFVar31 = ppFVar31 + 1;
        } while (ppFVar31 != local_38);
      }
      puVar11 = (local_40->dataSegments).
                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar36 = (local_40->dataSegments).
                     super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar36 != puVar11;
          puVar36 = puVar36 + 1) {
        pDVar12 = (puVar36->_M_t).
                  super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                  .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar12->offset != (Expression *)0x0) {
          Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::walk
                    ((Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_> *)&local_2e0,
                     &pDVar12->offset);
        }
      }
      local_2e0.currModule = (Module *)0x0;
      if (local_2e0.stack.flexible.
          super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2e0.stack.flexible.
                        super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2e0.stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2e0.stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      Pass::~Pass((Pass *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
    }
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_d8);
    std::_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Deque_base
              ((_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_128);
    std::
    _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_1b0);
    if (local_160 != (undefined1  [8])0x0) {
      operator_delete((void *)local_160,(long)local_150._M_nxt - (long)local_160);
    }
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&propagator.subTypes.types.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    if (local_388 != (undefined1  [8])0x0) {
      operator_delete((void *)local_388,
                      (long)propagator.subTypes.types.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_388);
    }
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    if (!getPassOptions().closedWorld) {
      Fatal() << "TypeRefining requires --closed-world";
    }

    Propagator propagator(*module);

    // Compute our main data structure, finalInfos, either normally or using
    // GUFA.
    if (!gufa) {
      computeFinalInfos(module, propagator);
    } else {
      computeFinalInfosGUFA(module, propagator);
    }

    useFinalInfos(module, propagator);
  }